

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  pointer pcVar1;
  int iVar2;
  string name;
  ostringstream oss;
  string local_2f0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  ostringstream local_2b0 [112];
  ios_base local_240 [264];
  TestCase local_138;
  
  pcVar1 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,pcVar1,
             pcVar1 + (testCase->super_TestCaseInfo).name._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_2d0);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"Anonymous test case ",0x14);
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_138,testCase,&local_2f0);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_138);
    TestCase::~TestCase(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream(local_2b0);
    std::ios_base::~ios_base(local_240);
  }
  else {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }
            m_functions.push_back( testCase );
        }